

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_screen_window_center(exr_const_context_t_conflict ctxt,int part_index,exr_attr_v2f_t *out)

{
  exr_priv_part_t p_Var1;
  exr_attribute_t *peVar2;
  int32_t iVar3;
  exr_result_t eVar4;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar4 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar4 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar4;
    }
    if (out == (exr_attr_v2f_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar4 = (*ctxt->print_error)
                        (ctxt,3,"NULL output for \'%s\'","screenWindowCenter",ctxt->print_error);
      return eVar4;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    peVar2 = p_Var1->screenWindowCenter;
    if (peVar2 == (exr_attribute_t *)0x0) {
      eVar4 = 0xf;
    }
    else {
      if (peVar2->type != EXR_ATTR_V2F) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        }
        eVar4 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           p_Var1->screenWindowCenter->type_name,"screenWindowCenter",
                           ctxt->print_error);
        return eVar4;
      }
      iVar3 = (((peVar2->field_6).box2i)->min).y;
      out->x = (float)(((peVar2->field_6).box2i)->min).x;
      out->y = (float)iVar3;
      eVar4 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_get_screen_window_center (
    exr_const_context_t ctxt, int part_index, exr_attr_v2f_t* out)
{
    REQ_ATTR_GET_IMPL_DEREF (screenWindowCenter, v2f, EXR_ATTR_V2F);
}